

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_codewscope(void)

{
  uint uVar1;
  byte bVar2;
  int32_t iVar3;
  int iVar4;
  int __fd;
  undefined8 uVar5;
  bson_t *_t;
  char *pcVar6;
  bson_t *pbVar7;
  undefined8 uVar8;
  char **ppcVar9;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  ulong uVar10;
  bool bVar11;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t *bcon;
  bson_t *scope;
  bson_t oscope;
  char *code;
  uint32_t local_210;
  uint local_1bc;
  uint local_1b8;
  bson_t local_180;
  char *local_98 [18];
  
  uVar5 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(10);
  _t = (bson_t *)bcon_new(0,"b",uVar5,0xf,iVar3);
  uVar5 = bson_bcon_magic();
  pcVar6 = bcon_ensure_const_char_ptr("var a = b;");
  pbVar7 = bcon_ensure_const_bson_ptr(_t);
  uVar5 = bcon_new(0,"foo",uVar5,0xe,pcVar6,pbVar7,0);
  uVar8 = bson_bcone_magic();
  ppcVar9 = bcon_ensure_const_char_ptr_ptr(local_98);
  pbVar7 = bcon_ensure_bson_ptr(&local_180);
  bVar2 = bcon_extract(uVar5,"foo",uVar8,0xe,ppcVar9,pbVar7,0);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xda,"test_codewscope","BCON_EXTRACT (bcon, \"foo\", BCONE_CODEWSCOPE (code, oscope))")
    ;
    abort();
  }
  iVar4 = strcmp(local_98[0],"var a = b;");
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xdc,"test_codewscope","strcmp (code, \"var a = b;\") == 0");
    abort();
  }
  __buf = (void *)bson_get_data(&local_180);
  __buf_00 = (void *)bson_get_data(_t);
  local_1bc = 0xffffffff;
  bVar11 = true;
  if (_t->len == local_180.len) {
    __s1 = (void *)bson_get_data(_t);
    __s2 = (void *)bson_get_data(&local_180);
    iVar4 = memcmp(__s1,__s2,(ulong)_t->len);
    bVar11 = iVar4 != 0;
  }
  if (!bVar11) {
    bson_destroy(&local_180);
    bson_destroy(_t);
    bson_destroy(uVar5);
    return;
  }
  uVar5 = bson_as_canonical_extended_json(&local_180,0);
  uVar8 = bson_as_canonical_extended_json(_t,0);
  local_1b8 = 0;
  while( true ) {
    bVar11 = false;
    if (local_1b8 < local_180.len) {
      bVar11 = local_1b8 < _t->len;
    }
    if (!bVar11) goto LAB_00147ef6;
    if (*(char *)((long)__buf + (ulong)local_1b8) != *(char *)((long)__buf_00 + (ulong)local_1b8))
    break;
    local_1b8 = local_1b8 + 1;
  }
  local_1bc = local_1b8;
LAB_00147ef6:
  if (local_1bc == 0xffffffff) {
    if (local_180.len < _t->len) {
      local_210 = _t->len;
    }
    else {
      local_210 = local_180.len;
    }
    local_1bc = local_210 - 1;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_1bc,uVar5,uVar8);
  iVar4 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar4 == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xdd,"test_codewscope","fd1 != -1");
    abort();
  }
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xdd,"test_codewscope","fd2 != -1");
    abort();
  }
  uVar10 = write(iVar4,__buf,(ulong)local_180.len);
  if (local_180.len == uVar10) {
    uVar1 = _t->len;
    uVar10 = write(__fd,__buf_00,(ulong)_t->len);
    if (uVar1 == uVar10) {
      close(iVar4);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
              ,0xdd,"test_codewscope","0");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xdd,"test_codewscope","(scope)->len == bson_write (fd2, expected_data, (scope)->len)")
    ;
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,0xdd,"test_codewscope","(&oscope)->len == bson_write (fd1, bson_data, (&oscope)->len)");
  abort();
}

Assistant:

static void
test_codewscope (void)
{
   bson_t bcon, expected, scope;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&scope);

   bson_append_int32 (&scope, "b", -1, 10);

   bson_append_code_with_scope (&expected, "foo", -1, "var a = b;", &scope);

   BCON_APPEND (&bcon, "foo", BCON_CODEWSCOPE ("var a = b;", &scope));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&scope);
}